

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O2

unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> __thiscall
duckdb::FileSystem::OpenFileExtended
          (FileSystem *this,OpenFileInfo *path,FileOpenFlags flags,
          optional_ptr<duckdb::FileOpener,_true> opener)

{
  NotImplementedException *this_00;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10,path,flags.flags,flags._8_8_);
  ::std::__cxx11::string::string
            ((string *)&local_38,"%s: OpenFileExtended is not implemented!",&local_59);
  (**(code **)((path->path)._M_dataplus._M_p + 0x138))(&local_58,path);
  NotImplementedException::NotImplementedException<std::__cxx11::string>
            (this_00,&local_38,&local_58);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FileHandle> FileSystem::OpenFileExtended(const OpenFileInfo &path, FileOpenFlags flags,
                                                    optional_ptr<FileOpener> opener) {
	// for backwards compatibility purposes - default to OpenFile
	throw NotImplementedException("%s: OpenFileExtended is not implemented!", GetName());
}